

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O1

int entropy_gather_internal(mbedtls_entropy_context *ctx)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  size_t olen;
  uchar buf [128];
  size_t local_c0;
  uchar local_b8 [136];
  
  if (ctx->source_count == 0) {
    iVar2 = -0x40;
  }
  else {
    if (ctx->source_count < 1) {
      iVar2 = -0x3d;
    }
    else {
      piVar3 = &ctx->source[0].strong;
      lVar4 = 0;
      bVar1 = false;
      do {
        if (*piVar3 == 1) {
          bVar1 = true;
        }
        local_c0 = 0;
        iVar2 = (*((mbedtls_entropy_source_state *)(piVar3 + -8))->f_source)
                          (*(void **)(piVar3 + -6),local_b8,0x80,&local_c0);
        if (iVar2 != 0) goto LAB_0012ce1f;
        if (local_c0 != 0) {
          iVar2 = entropy_update(ctx,(uchar)lVar4,local_b8,local_c0);
          if (iVar2 != 0) {
            return iVar2;
          }
          *(size_t *)(piVar3 + -4) = *(size_t *)(piVar3 + -4) + local_c0;
        }
        lVar4 = lVar4 + 1;
        piVar3 = piVar3 + 10;
      } while (lVar4 < ctx->source_count);
      iVar2 = -0x3d;
      if (bVar1) {
        iVar2 = 0;
      }
    }
LAB_0012ce1f:
    mbedtls_platform_zeroize(local_b8,0x80);
  }
  return iVar2;
}

Assistant:

static int entropy_gather_internal( mbedtls_entropy_context *ctx )
{
    int ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
    int i;
    int have_one_strong = 0;
    unsigned char buf[MBEDTLS_ENTROPY_MAX_GATHER];
    size_t olen;

    if( ctx->source_count == 0 )
        return( MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED );

    /*
     * Run through our entropy sources
     */
    for( i = 0; i < ctx->source_count; i++ )
    {
        if( ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG )
            have_one_strong = 1;

        olen = 0;
        if( ( ret = ctx->source[i].f_source( ctx->source[i].p_source,
                        buf, MBEDTLS_ENTROPY_MAX_GATHER, &olen ) ) != 0 )
        {
            goto cleanup;
        }

        /*
         * Add if we actually gathered something
         */
        if( olen > 0 )
        {
            if( ( ret = entropy_update( ctx, (unsigned char) i,
                                        buf, olen ) ) != 0 )
                return( ret );
            ctx->source[i].size += olen;
        }
    }

    if( have_one_strong == 0 )
        ret = MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE;

cleanup:
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    return( ret );
}